

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O2

void __thiscall chrono::ChBodyAuxRef::ChBodyAuxRef(ChBodyAuxRef *this,ChBodyAuxRef *other)

{
  ChVector<double> local_68;
  ChQuaternion<double> local_50;
  
  (this->super_ChBody).super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_011504f8;
  ChBody::ChBody(&this->super_ChBody,&PTR_construction_vtable_24__011513c0,&other->super_ChBody);
  (this->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj = (_func_int **)0x1150e60;
  (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
  _vptr_ChFrame = (_func_int **)0x1151160;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChContactable._vptr_ChContactable =
       (_func_int **)0x11511f8;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  (this->super_ChBody).super_ChLoadableUVW = (ChLoadableUVW)0x1151330;
  local_68.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_50.m_data[0] = 1.0;
  local_50.m_data[3] = 0.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->auxref_to_cog,&local_68,&local_50);
  local_68.m_data[2] = 0.0;
  local_50.m_data[0] = 1.0;
  local_50.m_data[3] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->auxref_to_abs,&local_68,&local_50);
  ChFrameMoving<double>::operator=(&this->auxref_to_cog,&other->auxref_to_cog);
  ChFrameMoving<double>::operator=(&this->auxref_to_abs,&other->auxref_to_abs);
  return;
}

Assistant:

ChBodyAuxRef::ChBodyAuxRef(const ChBodyAuxRef& other) : ChBody(other) {
    auxref_to_cog = other.auxref_to_cog;
    auxref_to_abs = other.auxref_to_abs;
}